

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O3

AssertionResult * __thiscall
iutest::internal::CmpHelperEQ<test::Point,test::Point>
          (AssertionResult *__return_storage_ptr__,internal *this,char *expected_str,
          char *actual_str,Point *expected,Point *actual)

{
  undefined4 in_EAX;
  Point *pPVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  string local_68;
  string local_48;
  
  iVar3 = -(uint)((int)*(undefined8 *)actual_str == (*expected).x);
  iVar4 = -(uint)((int)((ulong)*(undefined8 *)actual_str >> 0x20) == (*expected).y);
  auVar2._4_4_ = iVar3;
  auVar2._0_4_ = iVar3;
  auVar2._8_4_ = iVar4;
  auVar2._12_4_ = iVar4;
  iVar3 = movmskpd(in_EAX,auVar2);
  if (iVar3 == 3) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  else {
    pPVar1 = (Point *)actual_str;
    FormatForComparisonFailureMessage<test::Point,test::Point>
              (&local_48,(internal *)actual_str,expected,(Point *)actual_str);
    FormatForComparisonFailureMessage<test::Point,test::Point>
              (&local_68,(internal *)expected,(Point *)actual_str,pPVar1);
    EqFailure(__return_storage_ptr__,(char *)this,expected_str,&local_48,&local_68,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( iuOperatorEQ(actual, expected) )
    {
        return AssertionSuccess();
    }